

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O3

void __thiscall
luna::Library::RegisterToTable(Library *this,Table *table,TableMemberReg *table_reg,size_t size)

{
  ValueT VVar1;
  anon_union_8_9_8deb4486_for_Value_0 aVar2;
  anon_union_8_9_8deb4486_for_Value_0 local_58;
  undefined4 local_50;
  anon_union_8_9_8deb4486_for_Value_0 local_48;
  undefined4 local_40;
  anon_union_8_9_8deb4486_for_Value_0 local_38;
  
  if (size != 0) {
    do {
      VVar1 = table_reg->type_;
      if (VVar1 == ValueT_Number) {
        local_38 = *(anon_union_8_9_8deb4486_for_Value_0 *)&table_reg->field_1;
        local_40 = 4;
        local_48.str_ = State::GetString(this->state_,table_reg->name_);
        local_50 = 2;
        local_58 = local_38;
LAB_0012b479:
        Table::SetValue(table,(Value *)&local_48,(Value *)&local_58);
      }
      else if (VVar1 == ValueT_String) {
        RegisterString(this,table,table_reg->name_,(table_reg->field_1).str_);
      }
      else if (VVar1 == ValueT_CFunction) {
        aVar2 = *(anon_union_8_9_8deb4486_for_Value_0 *)&table_reg->field_1;
        local_40 = 4;
        local_48.str_ = State::GetString(this->state_,table_reg->name_);
        local_50 = 9;
        local_58 = aVar2;
        goto LAB_0012b479;
      }
      table_reg = table_reg + 1;
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

void Library::RegisterToTable(Table *table, const TableMemberReg *table_reg,
                                  std::size_t size)
    {
        for (std::size_t i = 0; i < size; ++i)
        {
            switch (table_reg[i].type_)
            {
                case ValueT_CFunction:
                    RegisterFunc(table, table_reg[i].name_, table_reg[i].func_);
                    break;
                case ValueT_Number:
                    RegisterNumber(table, table_reg[i].name_, table_reg[i].number_);
                    break;
                case ValueT_String:
                    RegisterString(table, table_reg[i].name_, table_reg[i].str_);
                    break;
                default: break;
            }
        }
    }